

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O1

void __thiscall IndexManager::InsertSuchKey(IndexManager *this,IndexInfo *I,Addr p,value *v)

{
  int iVar1;
  long lVar2;
  pointer pcVar3;
  long *plVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  long *plVar8;
  string filename;
  long *local_130;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  key_type local_b0;
  key_type local_90;
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,&this->Direction,&I->tableName);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_100 = *plVar8;
    lStack_f8 = plVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar8;
    local_110 = (long *)*plVar4;
  }
  local_108 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_110,(ulong)(I->indexName)._M_dataplus._M_p);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_e0 = *plVar8;
    lStack_d8 = plVar4[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar8;
    local_f0 = (long *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_120 = *plVar8;
    lStack_118 = plVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar8;
    local_130 = (long *)*plVar4;
  }
  lVar2 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar1 = v->type;
  if (iVar1 == 90000) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_130,lVar2 + (long)local_130)
    ;
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>_>
            ::find(&(this->BpTrees_F)._M_t,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    BpTree<float>::InsertKey((BpTree<float> *)(iVar6._M_node + 2),v->floatV,p);
  }
  else if (iVar1 == 50000) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_130,lVar2 + (long)local_130)
    ;
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>_>
            ::find(&(this->BpTrees_I)._M_t,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    BpTree<int>::InsertKey((BpTree<int> *)(iVar5._M_node + 2),v->intV,p);
  }
  else if (120000 < iVar1) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_130,lVar2 + (long)local_130)
    ;
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::find(&(this->BpTrees_S)._M_t,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (v->charV)._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar3,pcVar3 + (v->charV)._M_string_length);
    BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertKey((BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(iVar7._M_node + 2),&local_d0,p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  return;
}

Assistant:

void IndexManager::InsertSuchKey(IndexInfo I, Addr p, value v) {
	string filename = Direction + I.tableName + "_" + I.indexName + "_idx.dat";
	if (v.type == 50000) {
		BpTree<int>& Tree = FindBpTree_I(filename);
		Tree.InsertKey(v.intV, p);
	}
	else if (v.type == 90000) {
		BpTree<float>& Tree = FindBpTree_F(filename);
		Tree.InsertKey(v.floatV, p);
	}
	else if (v.type > 120000) {
		BpTree<string>& Tree = FindBpTree_S(filename);
		Tree.InsertKey(v.charV, p);
	}
}